

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

int Fraig_ManCheckClauseUsingSat
              (Fraig_Man_t *p,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int nBTLimit)

{
  int iVar1;
  Fraig_Node_t *pOld;
  Fraig_Node_t *pNew;
  abctime aVar2;
  abctime aVar3;
  int fVerbose;
  abctime clk;
  int i;
  int RetValue1;
  int RetValue;
  Fraig_Node_t *pNode2R;
  Fraig_Node_t *pNode1R;
  int nBTLimit_local;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  Fraig_Man_t *p_local;
  
  pOld = (Fraig_Node_t *)((ulong)pNode1 & 0xfffffffffffffffe);
  pNew = (Fraig_Node_t *)((ulong)pNode2 & 0xfffffffffffffffe);
  if (pOld == pNew) {
    __assert_fail("pNode1R != pNode2R",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x296,
                  "int Fraig_ManCheckClauseUsingSat(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int)"
                 );
  }
  if (p->pSat == (Msat_Solver_t *)0x0) {
    Fraig_ManCreateSolver(p);
  }
  for (clk._4_4_ = Msat_SolverReadVarNum(p->pSat); clk._4_4_ < p->vNodes->nSize;
      clk._4_4_ = clk._4_4_ + 1) {
    Msat_SolverAddVar(p->pSat,p->vNodes->pArray[clk._4_4_]->Level);
  }
  aVar2 = Abc_Clock();
  Fraig_OrderVariables(p,pOld,pNew);
  aVar3 = Abc_Clock();
  p->timeTrav = (aVar3 - aVar2) + p->timeTrav;
  Msat_SolverPrepare(p->pSat,p->vVarsInt);
  Msat_IntVecClear(p->vProj);
  Msat_IntVecPush(p->vProj,pOld->Num * 2 + (uint)((((ulong)pNode1 & 1) != 0 ^ 0xffU) & 1));
  Msat_IntVecPush(p->vProj,pNew->Num * 2 + (uint)((((ulong)pNode2 & 1) != 0 ^ 0xffU) & 1));
  aVar2 = Abc_Clock();
  iVar1 = Msat_SolverSolve(p->pSat,p->vProj,nBTLimit,1000000);
  aVar3 = Abc_Clock();
  p->timeSat = (aVar3 - aVar2) + p->timeSat;
  if (iVar1 == -1) {
    Msat_IntVecClear(p->vProj);
    Msat_IntVecPush(p->vProj,pOld->Num * 2 + ((uint)pNode1 & 1));
    Msat_IntVecPush(p->vProj,pNew->Num * 2 + ((uint)pNode2 & 1));
    iVar1 = Msat_SolverAddClause(p->pSat,p->vProj);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fraig/fraigSat.c"
                    ,0x2c4,
                    "int Fraig_ManCheckClauseUsingSat(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int)"
                   );
    }
    p_local._4_4_ = 1;
  }
  else if (iVar1 == 1) {
    p->nSatCounterImp = p->nSatCounterImp + 1;
    p_local._4_4_ = 0;
  }
  else {
    aVar3 = Abc_Clock();
    p->time3 = (aVar3 - aVar2) + p->time3;
    p->nSatFailsImp = p->nSatFailsImp + 1;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fraig_ManCheckClauseUsingSat( Fraig_Man_t * p, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int nBTLimit )
{
    Fraig_Node_t * pNode1R, * pNode2R;
    int RetValue, RetValue1, i;
    abctime clk;
    int fVerbose = 0;

    pNode1R = Fraig_Regular(pNode1);
    pNode2R = Fraig_Regular(pNode2);
    assert( pNode1R != pNode2R );

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
        Fraig_ManCreateSolver( p );
    // make sure the SAT solver has enough variables
    for ( i = Msat_SolverReadVarNum(p->pSat); i < p->vNodes->nSize; i++ )
        Msat_SolverAddVar( p->pSat, p->vNodes->pArray[i]->Level );

   // get the logic cone
clk = Abc_Clock();
    Fraig_OrderVariables( p, pNode1R, pNode2R );
//    Fraig_PrepareCones( p, pNode1R, pNode2R );
p->timeTrav += Abc_Clock() - clk;

    ////////////////////////////////////////////
    // prepare the solver to run incrementally on these variables
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode1R->Num, !Fraig_IsComplement(pNode1)) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode2R->Num, !Fraig_IsComplement(pNode2)) );
    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, 1000000 );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode1R->Num, Fraig_IsComplement(pNode1)) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNode2R->Num, Fraig_IsComplement(pNode2)) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
//        p->nSatProofImp++;
        return 1;
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}
        // record the counter example
//        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pNode1R, pNode2R );
        p->nSatCounterImp++;
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;
        p->nSatFailsImp++;
        return 0;
    }
}